

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::roundSignificandWithExponent
          (IEEEFloat *this,integerPart *decSigParts,uint sigPartCount,int exp,
          roundingMode rounding_mode)

{
  short sVar1;
  IEEEFloat *pIVar2;
  uint uVar3;
  uint uVar4;
  opStatus oVar5;
  opStatus oVar6;
  lostFraction lVar7;
  int iVar8;
  byte bVar9;
  byte bVar10;
  WordType *pWVar11;
  uint uVar12;
  uint parts;
  uint uVar13;
  IEEEFloat *src;
  IEEEFloat *pIVar14;
  ulong uVar15;
  WordType WVar16;
  Significand *dst;
  integerPart *piVar17;
  ulong uVar18;
  uint n;
  long lVar19;
  uint uVar20;
  WordType WVar21;
  IEEEFloat *local_4bf8;
  fltSemantics calcSemantics;
  opStatus local_4bc4;
  uint partsCount [16];
  integerPart pow5s [1205];
  integerPart pow5Parts [600];
  IEEEFloat pow5;
  
  calcSemantics.sizeInBits = 0;
  calcSemantics.maxExponent = 0x7fff;
  calcSemantics.minExponent = -0x7fff;
  calcSemantics.precision = 0;
  uVar12 = -exp;
  if (0 < exp) {
    uVar12 = exp;
  }
  pow5s[0] = 0x5f5e1;
  partsCount[2] = 0;
  partsCount[3] = 0;
  partsCount[0xc] = 0;
  partsCount[0xd] = 0;
  partsCount[0xe] = 0;
  partsCount[0xf] = 0;
  partsCount[8] = 0;
  partsCount[9] = 0;
  partsCount[10] = 0;
  partsCount[0xb] = 0;
  partsCount[4] = 0;
  partsCount[5] = 0;
  partsCount[6] = 0;
  partsCount[7] = 0;
  partsCount[0] = 1;
  partsCount[1] = 0;
  if (0x3fff < uVar12) {
    __assert_fail("power <= maxExponent",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x21e,"unsigned int llvm::powerOf5(APFloatBase::integerPart *, unsigned int)");
  }
  uVar3 = this->semantics->precision + 0x4a >> 6;
  pow5Parts[0] = *(integerPart *)
                  (powerOf5(unsigned_long*,unsigned_int)::firstEightPowers + (ulong)(uVar12 & 7) * 8
                  );
  parts = 1;
  pWVar11 = pow5s;
  local_4bf8 = &pow5;
  lVar19 = 0;
  src = (IEEEFloat *)pow5Parts;
  for (uVar12 = uVar12 >> 3; uVar12 != 0; uVar12 = uVar12 >> 1) {
    uVar15 = (ulong)partsCount[lVar19];
    if (partsCount[lVar19] == 0) {
      uVar4 = partsCount[(int)lVar19 - 1];
      APInt::tcFullMultiply(pWVar11,pWVar11 + -(ulong)uVar4,pWVar11 + -(ulong)uVar4,uVar4,uVar4);
      uVar15 = (ulong)(uVar4 * 2 - 1);
      if (pWVar11[uVar15] != 0) {
        uVar15 = (ulong)(uVar4 * 2);
      }
      partsCount[lVar19] = (uint)uVar15;
    }
    uVar20 = (uint)uVar15;
    pIVar14 = src;
    pIVar2 = local_4bf8;
    uVar4 = parts;
    if ((uVar12 & 1) != 0) {
      APInt::tcFullMultiply((WordType *)local_4bf8,(WordType *)src,pWVar11,parts,uVar20);
      uVar4 = (uVar20 - 1) + parts;
      pIVar14 = local_4bf8;
      pIVar2 = src;
      if ((&local_4bf8->semantics)[uVar4] != (fltSemantics *)0x0) {
        uVar4 = parts + uVar20;
      }
    }
    parts = uVar4;
    local_4bf8 = pIVar2;
    pWVar11 = pWVar11 + uVar15;
    lVar19 = lVar19 + 1;
    src = pIVar14;
  }
  if (src != (IEEEFloat *)pow5Parts) {
    APInt::tcAssign(pow5Parts,(WordType *)src,parts);
  }
  do {
    calcSemantics.precision = uVar3 * 0x40 - 1;
    uVar12 = calcSemantics.precision - this->semantics->precision;
    IEEEFloat((IEEEFloat *)pow5s,&calcSemantics,uninitialized);
    makeZero((IEEEFloat *)pow5s,(bool)((this->field_0x12 & 8) >> 3));
    IEEEFloat(&pow5,&calcSemantics);
    oVar5 = convertFromUnsignedParts
                      ((IEEEFloat *)pow5s,decSigParts,sigPartCount,rmNearestTiesToEven);
    oVar6 = convertFromUnsignedParts(&pow5,pow5Parts,parts,rmNearestTiesToEven);
    pow5s[2]._0_2_ = (short)pow5s[2] + (short)exp;
    uVar4 = uVar12;
    if (exp < 0) {
      lVar7 = divideSignificand((IEEEFloat *)pow5s,&pow5);
      sVar1 = this->semantics->minExponent;
      if (((short)pow5s[2] < sVar1) &&
         (uVar4 = ((int)sVar1 - (int)(short)pow5s[2]) + uVar12, uVar12 = calcSemantics.precision,
         uVar4 < calcSemantics.precision)) {
        uVar12 = uVar4;
      }
      uVar20 = (uint)(oVar6 != opOK || lVar7 != lfExactlyZero) * 2;
    }
    else {
      lVar7 = multiplySignificand((IEEEFloat *)pow5s,&pow5,(IEEEFloat *)0x0);
      uVar20 = (uint)(oVar6 != opOK);
    }
    piVar17 = pow5s + 1;
    if (*(int *)(pow5s[0] + 4) - 0x40U < 0xffffff80) {
      piVar17 = (integerPart *)pow5s[1];
    }
    iVar8 = APInt::tcExtractBit(piVar17,calcSemantics.precision - 1);
    if (iVar8 != 1) {
      __assert_fail("APInt::tcExtractBit (decSig.significandParts(), calcSemantics.precision - 1) == 1"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x969,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::roundSignificandWithExponent(const integerPart *, unsigned int, int, roundingMode)"
                   );
    }
    iVar8 = (uVar20 + 1) - (uint)(oVar5 == opOK);
    uVar20 = (uint)(lVar7 != lfExactlyZero) + iVar8 * 2;
    if (iVar8 == 0) {
      uVar20 = (uint)(lVar7 != lfExactlyZero) * 2;
    }
    pWVar11 = pow5s + 1;
    if (*(int *)(pow5s[0] + 4) - 0x40U < 0xffffff80) {
      pWVar11 = (WordType *)pow5s[1];
    }
    if (uVar12 == 0) {
      __assert_fail("bits != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x1ee,
                    "APFloatBase::integerPart llvm::ulpsFromBoundary(const APFloatBase::integerPart *, unsigned int, bool)"
                   );
    }
    uVar13 = uVar12 - 1 >> 6;
    bVar9 = (byte)(uVar12 - 1);
    bVar10 = bVar9 & 0x3f ^ 0x3f;
    uVar15 = (pWVar11[uVar13] << bVar10) >> bVar10;
    uVar18 = 1L << (bVar9 & 0x3f);
    if ((rounding_mode & ~rmNearestTiesToAway) != rmNearestTiesToEven) {
      uVar18 = 0;
    }
    if (uVar12 < 0x41) {
      WVar16 = uVar15 - uVar18;
      WVar21 = -WVar16;
      if (0 < (long)WVar16) {
        WVar21 = WVar16;
      }
    }
    else {
      if (uVar15 == uVar18) {
        do {
          uVar13 = uVar13 - 1;
          if (uVar13 == 0) {
            WVar21 = *pWVar11;
            goto LAB_0017bd77;
          }
        } while (pWVar11[uVar13] == 0);
      }
      else {
        WVar21 = 0xffffffffffffffff;
        if (uVar15 != uVar18 - 1) goto LAB_0017bd77;
        do {
          uVar13 = uVar13 - 1;
          if (uVar13 == 0) {
            WVar21 = -*pWVar11;
            goto LAB_0017bd77;
          }
        } while (pWVar11[uVar13] == 0xffffffffffffffff);
      }
      WVar21 = 0xffffffffffffffff;
    }
LAB_0017bd77:
    if ((ulong)uVar20 <= WVar21 * 2) {
      uVar13 = this->semantics->precision;
      dst = &this->significand;
      if (uVar13 - 0x40 < 0xffffff80) {
        dst = (Significand *)(this->significand).parts;
      }
      APInt::tcExtract(&dst->part,uVar13 + 0x40 >> 6,pWVar11,calcSemantics.precision - uVar12,uVar12
                      );
      this->exponent =
           ((short)uVar12 + (short)(undefined4)pow5s[2] + (short)this->semantics->precision) -
           (short)calcSemantics.precision;
      piVar17 = pow5s + 1;
      if (*(int *)(pow5s[0] + 4) - 0x40U < 0xffffff80) {
        piVar17 = (integerPart *)pow5s[1];
      }
      lVar7 = lostFractionThroughTruncation(piVar17,*(int *)(pow5s[0] + 4) + 0x40U >> 6,uVar4);
      local_4bc4 = normalize(this,rounding_mode,lVar7);
    }
    ~IEEEFloat(&pow5);
    ~IEEEFloat((IEEEFloat *)pow5s);
    uVar3 = uVar3 * 2;
    if ((ulong)uVar20 <= WVar21 * 2) {
      return local_4bc4;
    }
  } while( true );
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::roundSignificandWithExponent(const integerPart *decSigParts,
                                        unsigned sigPartCount, int exp,
                                        roundingMode rounding_mode) {
  unsigned int parts, pow5PartCount;
  fltSemantics calcSemantics = { 32767, -32767, 0, 0 };
  integerPart pow5Parts[maxPowerOfFiveParts];
  bool isNearest;

  isNearest = (rounding_mode == rmNearestTiesToEven ||
               rounding_mode == rmNearestTiesToAway);

  parts = partCountForBits(semantics->precision + 11);

  /* Calculate pow(5, abs(exp)).  */
  pow5PartCount = powerOf5(pow5Parts, exp >= 0 ? exp: -exp);

  for (;; parts *= 2) {
    opStatus sigStatus, powStatus;
    unsigned int excessPrecision, truncatedBits;

    calcSemantics.precision = parts * integerPartWidth - 1;
    excessPrecision = calcSemantics.precision - semantics->precision;
    truncatedBits = excessPrecision;

    IEEEFloat decSig(calcSemantics, uninitialized);
    decSig.makeZero(sign);
    IEEEFloat pow5(calcSemantics);

    sigStatus = decSig.convertFromUnsignedParts(decSigParts, sigPartCount,
                                                rmNearestTiesToEven);
    powStatus = pow5.convertFromUnsignedParts(pow5Parts, pow5PartCount,
                                              rmNearestTiesToEven);
    /* Add exp, as 10^n = 5^n * 2^n.  */
    decSig.exponent += exp;

    lostFraction calcLostFraction;
    integerPart HUerr, HUdistance;
    unsigned int powHUerr;

    if (exp >= 0) {
      /* multiplySignificand leaves the precision-th bit set to 1.  */
      calcLostFraction = decSig.multiplySignificand(pow5, nullptr);
      powHUerr = powStatus != opOK;
    } else {
      calcLostFraction = decSig.divideSignificand(pow5);
      /* Denormal numbers have less precision.  */
      if (decSig.exponent < semantics->minExponent) {
        excessPrecision += (semantics->minExponent - decSig.exponent);
        truncatedBits = excessPrecision;
        if (excessPrecision > calcSemantics.precision)
          excessPrecision = calcSemantics.precision;
      }
      /* Extra half-ulp lost in reciprocal of exponent.  */
      powHUerr = (powStatus == opOK && calcLostFraction == lfExactlyZero) ? 0:2;
    }

    /* Both multiplySignificand and divideSignificand return the
       result with the integer bit set.  */
    assert(APInt::tcExtractBit
           (decSig.significandParts(), calcSemantics.precision - 1) == 1);

    HUerr = HUerrBound(calcLostFraction != lfExactlyZero, sigStatus != opOK,
                       powHUerr);
    HUdistance = 2 * ulpsFromBoundary(decSig.significandParts(),
                                      excessPrecision, isNearest);

    /* Are we guaranteed to round correctly if we truncate?  */
    if (HUdistance >= HUerr) {
      APInt::tcExtract(significandParts(), partCount(), decSig.significandParts(),
                       calcSemantics.precision - excessPrecision,
                       excessPrecision);
      /* Take the exponent of decSig.  If we tcExtract-ed less bits
         above we must adjust our exponent to compensate for the
         implicit right shift.  */
      exponent = (decSig.exponent + semantics->precision
                  - (calcSemantics.precision - excessPrecision));
      calcLostFraction = lostFractionThroughTruncation(decSig.significandParts(),
                                                       decSig.partCount(),
                                                       truncatedBits);
      return normalize(rounding_mode, calcLostFraction);
    }
  }
}